

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

void P_SpawnLinePortal(line_t_conflict *line)

{
  FLinePortal *pFVar1;
  FLinePortal *pFVar2;
  int iVar3;
  int iVar4;
  line_t_conflict *plVar5;
  ulong uVar6;
  BYTE BVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  
  if ((uint)line->args[2] < 4) {
    plVar5 = FindDestination(line,line->args[0]);
    TArray<FLinePortal,_FLinePortal>::Grow(&linePortals,1);
    uVar6 = (ulong)linePortals.Count;
    uVar9 = linePortals.Count + 1;
    line->portalindex = linePortals.Count;
    linePortals.Count = uVar9;
    pFVar1 = linePortals.Array + uVar6;
    pFVar1->mOrigin = (line_t *)0x0;
    pFVar1->mDestination = (line_t *)0x0;
    pFVar1->mSinRot = 0.0;
    pFVar1->mCosRot = 0.0;
    pFVar1->mType = '\0';
    pFVar1->mFlags = '\0';
    pFVar1->mDefFlags = '\0';
    pFVar1->mAlign = '\0';
    *(undefined4 *)&pFVar1->field_0x24 = 0;
    (pFVar1->mAngleDiff).Degrees = 0.0;
    (pFVar1->mDisplacement).X = 0.0;
    (pFVar1->mDisplacement).Y = 0.0;
    pFVar1->render_thinglist = (portnode_t *)0x0;
    pFVar1->mOrigin = (line_t *)line;
    pFVar1->mDestination = (line_t *)plVar5;
    uVar9 = line->args[2];
    BVar7 = (BYTE)uVar9;
    pFVar1->mType = BVar7;
    if ((uVar9 & 0xff) == 3) {
      pFVar1->mAlign = '\0';
    }
    else {
      uVar9 = 0;
      if ((uint)line->args[3] < 3) {
        uVar9 = line->args[3];
      }
      pFVar1->mAlign = (BYTE)uVar9;
      if ((BYTE)uVar9 != '\0' && BVar7 == '\x02') {
        Printf("\x1cGWarning: z-offsetting not allowed for interactive portals. Changing line %d to teleport-portal!\n"
               ,(ulong)(uint)((int)((ulong)((long)line - (long)lines) >> 3) * 0x286bca1b));
        pFVar1->mType = '\x01';
      }
    }
    if (pFVar1->mDestination != (line_t *)0x0) {
      bVar8 = 1;
      if (pFVar1->mType != '\0') {
        bVar8 = (pFVar1->mType != '\x01') << 3 | 7;
      }
      pFVar1->mDefFlags = bVar8;
    }
  }
  else if (((line->args[2] == 4) && (line->args[0] == 0)) &&
          (iVar3 = FTagManager::GetFirstLineID(&tagManager,line), 0 < numlines)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      iVar4 = FTagManager::GetFirstLineID
                        (&tagManager,(line_t_conflict *)((long)lines->args + lVar11 + -0x2c));
      if (((iVar4 == iVar3) && (*(int *)((long)lines->args + lVar11) == 1)) &&
         (*(int *)((long)lines->args + lVar11 + -4) == 0x9c)) {
        TArray<FLinePortal,_FLinePortal>::Grow(&linePortals,1);
        uVar6 = (ulong)linePortals.Count;
        uVar9 = linePortals.Count + 1;
        line->portalindex = linePortals.Count;
        linePortals.Count = uVar9;
        pFVar2 = linePortals.Array;
        pFVar1 = linePortals.Array + uVar6;
        pFVar1->mOrigin = (line_t *)0x0;
        pFVar1->mDestination = (line_t *)0x0;
        pFVar2[uVar6].render_thinglist = (portnode_t *)0x0;
        pFVar2[uVar6].mSinRot = 0.0;
        (&pFVar2[uVar6].mSinRot)[1] = 0.0;
        pFVar1 = pFVar2 + uVar6;
        pFVar1->mType = '\0';
        pFVar1->mFlags = '\0';
        pFVar1->mDefFlags = '\0';
        pFVar1->mAlign = '\0';
        *(undefined4 *)&pFVar1->field_0x24 = 0;
        ((DAngle *)(&pFVar1->mType + 8))->Degrees = 0.0;
        pFVar2[uVar6].mDisplacement.X = 0.0;
        pFVar2[uVar6].mDisplacement.Y = 0.0;
        pFVar2[uVar6].mOrigin = (line_t *)line;
        pFVar2[uVar6].mDestination = (line_t *)((long)lines->args + lVar11 + -0x2c);
        pFVar2[uVar6].mType = '\x03';
        pFVar2[uVar6].mDefFlags = '\x0f';
        pFVar2[uVar6].mAlign = '\0';
        TArray<FLinePortal,_FLinePortal>::Grow(&linePortals,1);
        uVar6 = (ulong)linePortals.Count;
        uVar9 = linePortals.Count + 1;
        *(uint *)((long)lines->bbox + lVar11 + 0x38) = linePortals.Count;
        linePortals.Count = uVar9;
        pFVar2 = linePortals.Array;
        linePortals.Array[uVar6].render_thinglist = (portnode_t *)0x0;
        pFVar2[uVar6].mSinRot = 0.0;
        (&pFVar2[uVar6].mSinRot)[1] = 0.0;
        pFVar1 = pFVar2 + uVar6;
        pFVar1->mType = '\0';
        pFVar1->mFlags = '\0';
        pFVar1->mDefFlags = '\0';
        pFVar1->mAlign = '\0';
        *(undefined4 *)&pFVar1->field_0x24 = 0;
        ((DAngle *)(&pFVar1->mType + 8))->Degrees = 0.0;
        pFVar2[uVar6].mDisplacement.X = 0.0;
        pFVar2[uVar6].mDisplacement.Y = 0.0;
        pFVar2[uVar6].mOrigin = (line_t *)0x0;
        pFVar2[uVar6].mDestination = (line_t *)0x0;
        pFVar2[uVar6].mOrigin = (line_t *)((long)lines->args + lVar11 + -0x2c);
        pFVar2[uVar6].mDestination = (line_t *)line;
        pFVar2[uVar6].mType = '\x03';
        pFVar2[uVar6].mDefFlags = '\x0f';
        pFVar2[uVar6].mAlign = '\0';
      }
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x98;
    } while (lVar10 < numlines);
  }
  return;
}

Assistant:

void P_SpawnLinePortal(line_t* line)
{
	// portal destination is special argument #0
	line_t* dst = NULL;

	if (line->args[2] >= PORTT_VISUAL && line->args[2] <= PORTT_LINKED)
	{
		dst = FindDestination(line, line->args[0]);

		line->portalindex = linePortals.Reserve(1);
		FLinePortal *port = &linePortals.Last();

		memset(port, 0, sizeof(FLinePortal));
		port->mOrigin = line;
		port->mDestination = dst;
		port->mType = BYTE(line->args[2]);	// range check is done above.

		if (port->mType == PORTT_LINKED)
		{
			// Linked portals have no z-offset ever.
			port->mAlign = PORG_ABSOLUTE;
		}
		else
		{
			port->mAlign = BYTE(line->args[3] >= PORG_ABSOLUTE && line->args[3] <= PORG_CEILING ? line->args[3] : PORG_ABSOLUTE);
			if (port->mType == PORTT_INTERACTIVE && port->mAlign != PORG_ABSOLUTE)
			{
				// Due to the way z is often handled, these pose a major issue for parts of the code that needs to transparently handle interactive portals.
				Printf(TEXTCOLOR_RED "Warning: z-offsetting not allowed for interactive portals. Changing line %d to teleport-portal!\n", int(line - lines));
				port->mType = PORTT_TELEPORT;
			}
		}
		if (port->mDestination != NULL)
		{
			port->mDefFlags = port->mType == PORTT_VISUAL ? PORTF_VISIBLE : port->mType == PORTT_TELEPORT ? PORTF_TYPETELEPORT : PORTF_TYPEINTERACTIVE;
		}
	}
	else if (line->args[2] == PORTT_LINKEDEE && line->args[0] == 0)
	{
		// EE-style portals require that the first line ID is identical and the first arg of the two linked linedefs are 0 and 1 respectively.

		int mytag = tagManager.GetFirstLineID(line);

		for (int i = 0; i < numlines; i++)
		{
			if (tagManager.GetFirstLineID(&lines[i]) == mytag && lines[i].args[0] == 1 && lines[i].special == Line_SetPortal)
			{
				line->portalindex = linePortals.Reserve(1);
				FLinePortal *port = &linePortals.Last();

				memset(port, 0, sizeof(FLinePortal));
				port->mOrigin = line;
				port->mDestination = &lines[i];
				port->mType = PORTT_LINKED;
				port->mAlign = PORG_ABSOLUTE;
				port->mDefFlags = PORTF_TYPEINTERACTIVE;

				// we need to create the backlink here, too.
				lines[i].portalindex = linePortals.Reserve(1);
				port = &linePortals.Last();

				memset(port, 0, sizeof(FLinePortal));
				port->mOrigin = &lines[i];
				port->mDestination = line;
				port->mType = PORTT_LINKED;
				port->mAlign = PORG_ABSOLUTE;
				port->mDefFlags = PORTF_TYPEINTERACTIVE;
			}
		}
	}
	else
	{
		// undefined type
		return;
	}
}